

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O2

Var Js::JavascriptObject::EntryToLocaleString(RecyclableObject *function,CallInfo callInfo,...)

{
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  ThreadContext *this;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  Attributes attributes;
  undefined4 *puVar7;
  Var pvVar8;
  JavascriptFunction *function_00;
  RecyclableObject *ptr;
  int in_stack_00000010;
  undefined1 local_68 [8];
  ArgumentReader args;
  CallInfo local_40;
  CallInfo callInfo_local;
  RecyclableObject *dynamicObject;
  Var toStringVar;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_40 = callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x175,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b8f86b;
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)local_68,&local_40,(Var *)&stack0x00000018);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_40 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x177,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00b8f86b;
    *puVar7 = 0;
  }
  if ((local_68._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x178,"(args.Info.Count)","Should always have implicit \'this\'");
    if (!bVar4) {
LAB_00b8f86b:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  pvVar8 = Arguments::operator[]((Arguments *)local_68,0);
  callInfo_local = (CallInfo)0x0;
  BVar6 = JavascriptConversion::ToObject(pvVar8,pSVar2,(RecyclableObject **)&callInfo_local);
  if (BVar6 == 0) {
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec42,L"Object.prototype.toLocaleString");
  }
  dynamicObject = (RecyclableObject *)0x0;
  BVar6 = JavascriptOperators::GetProperty
                    (pvVar8,(RecyclableObject *)callInfo_local,0x178,&dynamicObject,pSVar2,
                     (PropertyValueInfo *)0x0);
  if ((BVar6 == 0) || (bVar4 = JavascriptConversion::IsCallable(dynamicObject), !bVar4)) {
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec34,L"Object.prototype.toLocaleString");
  }
  function_00 = (JavascriptFunction *)VarTo<Js::RecyclableObject>(dynamicObject);
  if (function_00 ==
      (((pSVar2->super_ScriptContextBase).javascriptLibrary)->objectToStringFunction).ptr) {
    pvVar8 = ToStringHelper(pvVar8,pSVar2);
    return pvVar8;
  }
  this = pSVar2->threadContext;
  bVar4 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  args.super_Arguments.Values = (Type)pSVar2;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function_00);
  bVar5 = ThreadContext::HasNoSideEffect(this,(RecyclableObject *)function_00,attributes);
  if (bVar5) {
    ptr = (RecyclableObject *)
          EntryToLocaleString::anon_class_24_3_24541790::operator()
                    ((anon_class_24_3_24541790 *)&args.super_Arguments.Values);
    bVar5 = ThreadContext::IsOnStack(ptr);
  }
  else {
    if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_ToPrimitive;
      ptr = (((((((((function_00->super_DynamicObject).super_RecyclableObject.type.ptr)->
                  javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
              super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            undefinedValue.ptr;
      goto LAB_00b8f827;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this->implicitCallFlags;
      ptr = (RecyclableObject *)
            EntryToLocaleString::anon_class_24_3_24541790::operator()
                      ((anon_class_24_3_24541790 *)&args.super_Arguments.Values);
      this->implicitCallFlags = IVar1 | ImplicitCall_ToPrimitive;
      goto LAB_00b8f827;
    }
    ptr = (RecyclableObject *)
          EntryToLocaleString::anon_class_24_3_24541790::operator()
                    ((anon_class_24_3_24541790 *)&args.super_Arguments.Values);
    bVar5 = ThreadContext::IsOnStack(ptr);
  }
  if (bVar5 != false) {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_ToPrimitive;
  }
LAB_00b8f827:
  this->reentrancySafeOrHandled = bVar4;
  return ptr;
}

Assistant:

Var JavascriptObject::EntryToLocaleString(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();
    Assert(!(callInfo.Flags & CallFlags_New));
    AssertMsg(args.Info.Count, "Should always have implicit 'this'");

    Var thisValue = args[0];
    RecyclableObject* dynamicObject = nullptr;

    if (FALSE == JavascriptConversion::ToObject(thisValue, scriptContext, &dynamicObject))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Object.prototype.toLocaleString"));
    }

    Var toStringVar = nullptr;
    if (!JavascriptOperators::GetProperty(thisValue, dynamicObject, Js::PropertyIds::toString, &toStringVar, scriptContext) || !JavascriptConversion::IsCallable(toStringVar))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Object.prototype.toLocaleString"));
    }

    RecyclableObject* toStringFunc = VarTo<RecyclableObject>(toStringVar);
    if (toStringFunc == scriptContext->GetLibrary()->GetObjectToStringFunction())
    {
        return ToStringHelper(thisValue, scriptContext);
    }
    else
    {
        return scriptContext->GetThreadContext()->ExecuteImplicitCall(toStringFunc, Js::ImplicitCall_ToPrimitive, [=]()->Js::Var
        {
            return CALL_FUNCTION(scriptContext->GetThreadContext(), toStringFunc, CallInfo(CallFlags_Value, 1), thisValue);
        });
    }
}